

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O2

void __thiscall FIX::ConfigError::ConfigError(ConfigError *this,string *what)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Configuration failed",&local_39);
  Exception::Exception(&this->super_Exception,&local_38,what);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_Exception = &PTR__Exception_001fc728;
  return;
}

Assistant:

ConfigError(const std::string &what = "")
      : Exception("Configuration failed", what) {}